

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void fuzz_deserializer(void)

{
  char *data;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  ulong __size;
  
  lVar4 = 0;
  do {
    uVar3 = seed * 0x41c64e6d + 0x3039;
    uVar2 = (uVar3 & 0x3fffffff) % 10000;
    __size = (ulong)uVar2;
    seed = uVar3;
    data = (char *)malloc(__size);
    if (uVar2 != 0) {
      uVar1 = 0;
      do {
        uVar3 = uVar3 * 0x41c64e6d + 0x3039;
        data[uVar1] = (char)uVar3;
        uVar1 = uVar1 + 1;
        seed = uVar3;
      } while (__size != uVar1);
    }
    deserialization_test(data,__size);
    free(data);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10000);
  return;
}

Assistant:

DEFINE_TEST(fuzz_deserializer) {
    for (size_t i = 0; i < 10000; i++) {
        size_t vec_size = our_rand() % 10000;
        char *buffer = malloc(vec_size);
        for (size_t j = 0; j < vec_size; j++) {
            buffer[j] = our_rand() % 256;
        }
        deserialization_test(buffer, vec_size);
        free(buffer);
    }
}